

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O1

string * __thiscall
duckdb::ColumnDataCollection::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ColumnDataCollection *this)

{
  undefined8 *puVar1;
  bool bVar2;
  string *psVar3;
  undefined8 *puVar4;
  unsigned_long params;
  undefined8 uVar5;
  unsigned_long in_R8;
  unsigned_long in_R9;
  string *result;
  DataChunk chunk;
  ColumnDataScanState scan_state;
  undefined8 *local_190;
  undefined8 local_180;
  undefined8 uStack_178;
  string local_170;
  string local_150;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  Exception local_110;
  undefined1 local_100 [16];
  DataChunk local_f0;
  ColumnDataScanState local_b0;
  
  DataChunk::DataChunk(&local_f0);
  InitializeScanChunk(this,&local_f0);
  local_b0.current_chunk_state.handles._M_h._M_buckets =
       &local_b0.current_chunk_state.handles._M_h._M_single_bucket;
  local_b0.current_chunk_state.handles._M_h._M_bucket_count = 1;
  local_b0.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0.current_chunk_state.handles._M_h._M_element_count = 0;
  local_b0.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  local_b0.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b0.current_chunk_state.properties = INVALID;
  local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  InitializeScan(this,&local_b0,ALLOW_ZERO_COPY);
  local_110._0_8_ = local_100;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"ColumnDataCollection - [%llu Chunks, %llu Rows]\n","");
  psVar3 = (string *)ChunkCount(this);
  Exception::ConstructMessage<unsigned_long,unsigned_long>
            (__return_storage_ptr__,&local_110,psVar3,this->count,in_R8);
  if ((undefined1 *)local_110._0_8_ != local_100) {
    operator_delete((void *)local_110._0_8_);
  }
  psVar3 = (string *)0x0;
  params = 0;
  do {
    bVar2 = Scan(this,&local_b0,&local_f0);
    if (!bVar2) {
      if (local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_b0);
      DataChunk::~DataChunk(&local_f0);
      return __return_storage_ptr__;
    }
    local_130[0] = local_120;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"Chunk %llu - [Rows %llu - %llu]\n","");
    Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long>
              (&local_150,(Exception *)local_130,psVar3,params,local_f0.count + params,in_R9);
    DataChunk::ToString_abi_cxx11_(&local_170,&local_f0);
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      uVar5 = local_150.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_170._M_string_length + local_150._M_string_length) {
      uVar5 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        uVar5 = local_170.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < local_170._M_string_length + local_150._M_string_length) goto LAB_00dabfb6;
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_170,0,(char *)0x0,(ulong)local_150._M_dataplus._M_p);
    }
    else {
LAB_00dabfb6:
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::_M_append
                         ((char *)&local_150,(ulong)local_170._M_dataplus._M_p);
    }
    puVar1 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar1) {
      local_180 = *puVar1;
      uStack_178 = puVar4[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *puVar1;
      local_190 = (undefined8 *)*puVar4;
    }
    *puVar4 = puVar1;
    puVar4[1] = 0;
    *(undefined1 *)puVar1 = 0;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_190);
    if (local_190 != &local_180) {
      operator_delete(local_190);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if (local_130[0] != local_120) {
      operator_delete(local_130[0]);
    }
    psVar3 = (string *)((long)&(psVar3->_M_dataplus)._M_p + 1);
    params = params + local_f0.count;
  } while( true );
}

Assistant:

string ColumnDataCollection::ToString() const {
	DataChunk chunk;
	InitializeScanChunk(chunk);

	ColumnDataScanState scan_state;
	InitializeScan(scan_state);

	string result = StringUtil::Format("ColumnDataCollection - [%llu Chunks, %llu Rows]\n", ChunkCount(), Count());
	idx_t chunk_idx = 0;
	idx_t row_count = 0;
	while (Scan(scan_state, chunk)) {
		result +=
		    StringUtil::Format("Chunk %llu - [Rows %llu - %llu]\n", chunk_idx, row_count, row_count + chunk.size()) +
		    chunk.ToString();
		chunk_idx++;
		row_count += chunk.size();
	}

	return result;
}